

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

int cvEwtSet(N_Vector ycur,N_Vector weight,void *data)

{
  double dVar1;
  
  if (*(int *)((long)data + 0x24) == 2) {
    N_VAbs(ycur,*(undefined8 *)((long)data + 0xe0));
    N_VLinearSum(*(undefined8 *)((long)data + 0x28),*(undefined8 *)((long)data + 0xe0),
                 *(undefined8 *)((long)data + 0x38),*(undefined8 *)((long)data + 0xe0));
  }
  else {
    if (*(int *)((long)data + 0x24) != 1) {
      return 0;
    }
    N_VAbs(ycur,*(undefined8 *)((long)data + 0xe0));
    N_VScale(*(undefined8 *)((long)data + 0x28),*(undefined8 *)((long)data + 0xe0),
             *(undefined8 *)((long)data + 0xe0));
    N_VAddConst(*(undefined8 *)((long)data + 0x30),*(undefined8 *)((long)data + 0xe0),
                *(undefined8 *)((long)data + 0xe0));
  }
  if ((*(int *)((long)data + 0x40) != 0) &&
     (dVar1 = (double)N_VMin(*(undefined8 *)((long)data + 0xe0)), dVar1 <= 0.0)) {
    return -1;
  }
  N_VInv(*(undefined8 *)((long)data + 0xe0),weight);
  return 0;
}

Assistant:

int cvEwtSet(N_Vector ycur, N_Vector weight, void* data)
{
  CVodeMem cv_mem;
  int flag = 0;

  /* data points to cv_mem here */

  cv_mem = (CVodeMem)data;

  switch (cv_mem->cv_itol)
  {
  case CV_SS: flag = cvEwtSetSS(cv_mem, ycur, weight); break;
  case CV_SV: flag = cvEwtSetSV(cv_mem, ycur, weight); break;
  }

  return (flag);
}